

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  long lVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ImVec2 *pIVar7;
  ImDrawIdx IVar8;
  ImDrawVert *pIVar9;
  ulong uVar10;
  ImDrawIdx IVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ImDrawIdx *pIVar15;
  ImDrawIdx IVar16;
  undefined7 in_register_00000081;
  ulong uVar17;
  ImDrawIdx IVar18;
  uint uVar19;
  ImDrawIdx IVar20;
  bool bVar21;
  uint uVar22;
  undefined4 in_XMM0_Db;
  ImVec2 IVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float afStack_78 [2];
  undefined8 uStack_70;
  ImVec2 local_68;
  undefined8 local_60;
  undefined8 local_58;
  float afStack_50 [3];
  int local_44;
  undefined4 local_40;
  uint local_3c;
  float *local_38;
  
  if (points_count < 2) {
    return;
  }
  IVar3 = this->_Data->TexUvWhitePixel;
  local_60 = (ulong)(points_count - 1U);
  local_38 = (float *)(ulong)(points_count - 1U);
  if (closed) {
    local_38 = (float *)(ulong)(uint)points_count;
  }
  local_58 = CONCAT44(in_XMM0_Db,thickness);
  iVar14 = (int)local_38;
  if ((this->Flags & 1) == 0) {
    uStack_70 = 0x1a09c1;
    PrimReserve(this,iVar14 * 6,iVar14 * 4);
    pIVar9 = this->_VtxWritePtr;
    uVar10 = 1;
    do {
      uVar5 = uVar10 & 0xffffffff;
      if ((uint)points_count == uVar10) {
        uVar5 = 0;
      }
      fVar25 = points[uVar10 - 1].x;
      fVar24 = points[uVar5].x - fVar25;
      fVar30 = points[uVar10 - 1].y;
      fVar26 = points[uVar5].y - fVar30;
      fVar27 = fVar24 * fVar24 + fVar26 * fVar26;
      uVar22 = -(uint)(0.0 < fVar27);
      fVar27 = (float)(~uVar22 & 0x3f800000 | (uint)(1.0 / SQRT(fVar27)) & uVar22);
      fVar24 = fVar27 * fVar24 * (float)local_58 * 0.5;
      fVar27 = fVar27 * fVar26 * (float)local_58 * 0.5;
      IVar23.y = fVar30 - fVar24;
      IVar23.x = fVar25 + fVar27;
      pIVar9->pos = IVar23;
      pIVar9->uv = IVar3;
      pIVar9 = this->_VtxWritePtr;
      pIVar9->col = col;
      pIVar9[1].pos.x = points[uVar5].x + fVar27;
      pIVar9[1].pos.y = points[uVar5].y - fVar24;
      pIVar9[1].uv = IVar3;
      pIVar9 = this->_VtxWritePtr;
      pIVar9[1].col = col;
      pIVar9[2].pos.x = points[uVar5].x - fVar27;
      pIVar9[2].pos.y = points[uVar5].y + fVar24;
      pIVar9[2].uv = IVar3;
      pIVar9 = this->_VtxWritePtr;
      pIVar9[2].col = col;
      pIVar9[3].pos.x = points[uVar10 - 1].x - fVar27;
      pIVar9[3].pos.y = points[uVar10 - 1].y + fVar24;
      pIVar9[3].uv = IVar3;
      pIVar9 = this->_VtxWritePtr;
      pIVar9[3].col = col;
      pIVar9 = pIVar9 + 4;
      this->_VtxWritePtr = pIVar9;
      uVar22 = this->_VtxCurrentIdx;
      pIVar15 = this->_IdxWritePtr;
      IVar16 = (ImDrawIdx)uVar22;
      *pIVar15 = IVar16;
      pIVar15[1] = IVar16 + 1;
      pIVar15[2] = IVar16 + 2;
      pIVar15[3] = IVar16;
      pIVar15[4] = IVar16 + 2;
      pIVar15[5] = IVar16 + 3;
      this->_IdxWritePtr = pIVar15 + 6;
      this->_VtxCurrentIdx = uVar22 + 4;
      bVar21 = uVar10 != ((ulong)local_38 & 0xffffffff);
      uVar10 = uVar10 + 1;
    } while (bVar21);
    return;
  }
  local_40 = (undefined4)CONCAT71(in_register_00000081,closed);
  local_3c = col & 0xffffff;
  local_68._1_7_ = 0;
  local_68.x._0_1_ = 1.0 < thickness;
  iVar12 = 0xc;
  if (1.0 < thickness) {
    iVar12 = 0x12;
  }
  local_44 = points_count * 3;
  if (1.0 < thickness) {
    local_44 = points_count * 4;
  }
  uStack_70 = 0x1a0ba4;
  PrimReserve(this,iVar12 * iVar14,local_44);
  lVar4 = -((ulong)(uint)(((int)local_68.x * 2 + 3) * points_count) * 8 + 0xf & 0xfffffffffffffff0);
  puVar6 = (undefined8 *)((long)&local_68 + lVar4);
  uVar5 = (ulong)(uint)points_count;
  pfVar1 = (float *)(puVar6 + uVar5);
  uVar13 = (ulong)local_38 & 0xffffffff;
  uVar10 = 1;
  do {
    uVar17 = uVar10 & 0xffffffff;
    if (uVar5 == uVar10) {
      uVar17 = 0;
    }
    fVar24 = points[uVar17].x - points[uVar10 - 1].x;
    fVar25 = points[uVar17].y - points[uVar10 - 1].y;
    fVar27 = fVar24 * fVar24 + fVar25 * fVar25;
    uVar22 = -(uint)(0.0 < fVar27);
    fVar27 = (float)(~uVar22 & 0x3f800000 | (uint)(1.0 / SQRT(fVar27)) & uVar22);
    *(ulong *)((long)&uStack_70 + uVar10 * 8 + lVar4) = CONCAT44(fVar27 * -fVar24,fVar27 * fVar25);
    bVar21 = uVar10 != uVar13;
    uVar10 = uVar10 + 1;
  } while (bVar21);
  local_38 = pfVar1;
  if ((char)local_40 == '\0') {
    *(undefined8 *)(pfVar1 + -2) = *(undefined8 *)(pfVar1 + -4);
    if ((float)local_58 <= 1.0) {
      fVar27 = (float)*puVar6;
      fVar24 = (float)((ulong)*puVar6 >> 0x20);
      fVar25 = (*points).x;
      fVar30 = (*points).y;
      *pfVar1 = fVar27 + fVar25;
      pfVar1[1] = fVar24 + fVar30;
      pfVar1[2] = fVar25 - fVar27;
      pfVar1[3] = fVar30 - fVar24;
      uVar10 = local_60 & 0xffffffff;
      fVar27 = points[uVar10].x;
      fVar24 = points[uVar10].y;
      uVar17 = (ulong)(uint)((int)local_60 * 2);
      *(ulong *)(pfVar1 + uVar17 * 2) =
           CONCAT44((float)((ulong)puVar6[uVar10] >> 0x20) + fVar24,(float)puVar6[uVar10] + fVar27);
      *(ulong *)(pfVar1 + uVar17 * 2 + 2) =
           CONCAT44(fVar24 - (float)((ulong)puVar6[uVar10] >> 0x20),fVar27 - (float)puVar6[uVar10]);
      goto LAB_001a0fa5;
    }
    fVar31 = ((float)local_58 + -1.0) * 0.5;
    fVar27 = fVar31 + 1.0;
    fVar24 = (float)*puVar6;
    fVar25 = (float)((ulong)*puVar6 >> 0x20);
    fVar30 = fVar24 * fVar27;
    fVar26 = fVar25 * fVar27;
    fVar28 = (*points).x;
    fVar29 = (*points).y;
    fVar24 = fVar24 * fVar31;
    fVar25 = fVar25 * fVar31;
    *pfVar1 = fVar30 + fVar28;
    pfVar1[1] = fVar26 + fVar29;
    pfVar1[2] = fVar24 + fVar28;
    pfVar1[3] = fVar25 + fVar29;
    pfVar1[4] = fVar28 - fVar24;
    pfVar1[5] = fVar29 - fVar25;
    pfVar1[6] = fVar28 - fVar30;
    pfVar1[7] = fVar29 - fVar26;
    uVar10 = local_60 & 0xffffffff;
    fVar24 = points[uVar10].x;
    fVar25 = points[uVar10].y;
    uVar17 = (ulong)(uint)((int)local_60 << 2);
    *(ulong *)(pfVar1 + uVar17 * 2) =
         CONCAT44((float)((ulong)puVar6[uVar10] >> 0x20) * fVar27 + fVar25,
                  (float)puVar6[uVar10] * fVar27 + fVar24);
    *(ulong *)(pfVar1 + uVar17 * 2 + 2) =
         CONCAT44((float)((ulong)puVar6[uVar10] >> 0x20) * fVar31 + fVar25,
                  (float)puVar6[uVar10] * fVar31 + fVar24);
    *(ulong *)(pfVar1 + uVar17 * 2 + 4) =
         CONCAT44(fVar25 - (float)((ulong)puVar6[uVar10] >> 0x20) * fVar31,
                  fVar24 - (float)puVar6[uVar10] * fVar31);
    *(ulong *)(pfVar1 + uVar17 * 2 + 6) =
         CONCAT44(fVar25 - (float)((ulong)puVar6[uVar10] >> 0x20) * fVar27,
                  fVar24 - (float)puVar6[uVar10] * fVar27);
  }
  else {
    if ((float)local_58 <= 1.0) {
LAB_001a0fa5:
      pIVar15 = this->_IdxWritePtr;
      uVar10 = 1;
      uVar22 = this->_VtxCurrentIdx;
      do {
        uVar17 = uVar10 & 0xffffffff;
        if (uVar5 == uVar10) {
          uVar17 = 0;
        }
        uVar19 = uVar22 + 3;
        if (uVar5 == uVar10) {
          uVar19 = this->_VtxCurrentIdx;
        }
        uVar2 = *(undefined8 *)((long)&uStack_70 + uVar10 * 8 + lVar4);
        fVar27 = ((float)puVar6[uVar17] + (float)uVar2) * 0.5;
        fVar24 = ((float)((ulong)puVar6[uVar17] >> 0x20) + (float)((ulong)uVar2 >> 0x20)) * 0.5;
        fVar25 = fVar27 * fVar27 + fVar24 * fVar24;
        if (1e-06 < fVar25) {
          fVar25 = 1.0 / fVar25;
          fVar30 = 100.0;
          if (fVar25 <= 100.0) {
            fVar30 = fVar25;
          }
          fVar27 = fVar27 * fVar30;
          fVar24 = fVar24 * fVar30;
        }
        fVar25 = points[uVar17].x;
        fVar30 = points[uVar17].y;
        uVar17 = (ulong)(uint)((int)uVar17 * 2);
        *(ulong *)(pfVar1 + uVar17 * 2) = CONCAT44(fVar30 + fVar24,fVar25 + fVar27);
        *(ulong *)(pfVar1 + uVar17 * 2 + 2) = CONCAT44(fVar30 - fVar24,fVar25 - fVar27);
        IVar18 = (ImDrawIdx)uVar19;
        *pIVar15 = IVar18;
        IVar16 = (ImDrawIdx)uVar22;
        pIVar15[1] = IVar16;
        pIVar15[2] = IVar16 + 2;
        pIVar15[3] = IVar16 + 2;
        pIVar15[4] = IVar18 + 2;
        pIVar15[5] = IVar18;
        pIVar15[6] = IVar18 + 1;
        pIVar15[7] = IVar16 + 1;
        pIVar15[8] = IVar16;
        pIVar15[9] = IVar16;
        pIVar15[10] = IVar18;
        pIVar15[0xb] = IVar18 + 1;
        pIVar15 = pIVar15 + 0xc;
        bVar21 = uVar10 != uVar13;
        uVar10 = uVar10 + 1;
        uVar22 = uVar19;
      } while (bVar21);
      this->_IdxWritePtr = pIVar15;
      pIVar9 = this->_VtxWritePtr;
      pIVar7 = (ImVec2 *)(puVar6 + uVar5 + 1);
      uVar10 = 0;
      do {
        pIVar9->pos = points[uVar10];
        this->_VtxWritePtr->uv = IVar3;
        pIVar9 = this->_VtxWritePtr;
        pIVar9->col = col;
        pIVar9[1].pos = pIVar7[-1];
        this->_VtxWritePtr[1].uv = IVar3;
        pIVar9 = this->_VtxWritePtr;
        pIVar9[1].col = local_3c;
        pIVar9[2].pos = *pIVar7;
        this->_VtxWritePtr[2].uv = IVar3;
        pIVar9 = this->_VtxWritePtr;
        pIVar9[2].col = local_3c;
        pIVar9 = pIVar9 + 3;
        this->_VtxWritePtr = pIVar9;
        uVar10 = uVar10 + 1;
        pIVar7 = pIVar7 + 2;
      } while (uVar5 != uVar10);
      goto LAB_001a111d;
    }
    fVar31 = ((float)local_58 + -1.0) * 0.5;
  }
  pIVar15 = this->_IdxWritePtr;
  local_58 = -uVar13;
  uVar10 = 1;
  uVar22 = this->_VtxCurrentIdx;
  do {
    uVar17 = uVar10 & 0xffffffff;
    if (uVar5 == uVar10) {
      uVar17 = 0;
    }
    uVar19 = uVar22 + 4;
    if (uVar5 == uVar10) {
      uVar19 = this->_VtxCurrentIdx;
    }
    uVar2 = *(undefined8 *)((long)&uStack_70 + uVar10 * 8 + lVar4);
    fVar27 = ((float)puVar6[uVar17] + (float)uVar2) * 0.5;
    fVar24 = ((float)((ulong)puVar6[uVar17] >> 0x20) + (float)((ulong)uVar2 >> 0x20)) * 0.5;
    fVar25 = fVar27 * fVar27 + fVar24 * fVar24;
    if (1e-06 < fVar25) {
      fVar25 = 1.0 / fVar25;
      fVar30 = 100.0;
      if (fVar25 <= 100.0) {
        fVar30 = fVar25;
      }
      fVar27 = fVar27 * fVar30;
      fVar24 = fVar24 * fVar30;
    }
    fVar25 = (fVar31 + 1.0) * fVar27;
    fVar30 = (fVar31 + 1.0) * fVar24;
    fVar26 = points[uVar17].x;
    fVar28 = points[uVar17].y;
    uVar17 = (ulong)(uint)((int)uVar17 * 4);
    *(ulong *)(local_38 + uVar17 * 2) = CONCAT44(fVar28 + fVar30,fVar26 + fVar25);
    *(ulong *)(local_38 + uVar17 * 2 + 2) =
         CONCAT44(fVar28 + fVar24 * fVar31,fVar26 + fVar27 * fVar31);
    *(ulong *)(local_38 + uVar17 * 2 + 4) =
         CONCAT44(fVar28 - fVar24 * fVar31,fVar26 - fVar27 * fVar31);
    *(ulong *)(local_38 + uVar17 * 2 + 6) = CONCAT44(fVar28 - fVar30,fVar26 - fVar25);
    IVar16 = (ImDrawIdx)uVar19;
    IVar20 = IVar16 + 1;
    *pIVar15 = IVar20;
    IVar18 = (ImDrawIdx)uVar22;
    pIVar15[1] = IVar18 + 1;
    IVar11 = IVar18 + 2;
    pIVar15[2] = IVar11;
    pIVar15[3] = IVar11;
    IVar8 = IVar16 + 2;
    pIVar15[4] = IVar8;
    pIVar15[5] = IVar20;
    pIVar15[6] = IVar20;
    pIVar15[7] = IVar18 + 1;
    pIVar15[8] = IVar18;
    pIVar15[9] = IVar18;
    pIVar15[10] = IVar16;
    pIVar15[0xb] = IVar20;
    pIVar15[0xc] = IVar8;
    pIVar15[0xd] = IVar11;
    pIVar15[0xe] = IVar18 + 3;
    pIVar15[0xf] = IVar18 + 3;
    pIVar15[0x10] = IVar16 + 3;
    pIVar15[0x11] = IVar8;
    pIVar15 = pIVar15 + 0x12;
    bVar21 = uVar10 != uVar13;
    uVar10 = uVar10 + 1;
    uVar22 = uVar19;
  } while (bVar21);
  this->_IdxWritePtr = pIVar15;
  pIVar9 = this->_VtxWritePtr;
  pIVar7 = (ImVec2 *)(puVar6 + uVar5 + 3);
  do {
    pIVar9->pos = pIVar7[-3];
    this->_VtxWritePtr->uv = IVar3;
    pIVar9 = this->_VtxWritePtr;
    pIVar9->col = local_3c;
    pIVar9[1].pos = pIVar7[-2];
    this->_VtxWritePtr[1].uv = IVar3;
    pIVar9 = this->_VtxWritePtr;
    pIVar9[1].col = col;
    pIVar9[2].pos = pIVar7[-1];
    this->_VtxWritePtr[2].uv = IVar3;
    pIVar9 = this->_VtxWritePtr;
    pIVar9[2].col = col;
    pIVar9[3].pos = *pIVar7;
    this->_VtxWritePtr[3].uv = IVar3;
    pIVar9 = this->_VtxWritePtr;
    pIVar9[3].col = local_3c;
    pIVar9 = pIVar9 + 4;
    this->_VtxWritePtr = pIVar9;
    pIVar7 = pIVar7 + 4;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
LAB_001a111d:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_44;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2));
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            ImVec2 diff = points[i2] - points[i1];
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i1].x = diff.y;
            temp_normals[i1].y = -diff.x;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                dm *= AA_SIZE;
                temp_points[i2*2+0] = points[i2] + dm;
                temp_points[i2*2+1] = points[i2] - dm;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                ImVec2 dm_out = dm * (half_inner_thickness + AA_SIZE);
                ImVec2 dm_in = dm * half_inner_thickness;
                temp_points[i2*4+0] = points[i2] + dm_out;
                temp_points[i2*4+1] = points[i2] + dm_in;
                temp_points[i2*4+2] = points[i2] - dm_in;
                temp_points[i2*4+3] = points[i2] - dm_out;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];
            ImVec2 diff = p2 - p1;
            diff *= ImInvLength(diff, 1.0f);

            const float dx = diff.x * (thickness * 0.5f);
            const float dy = diff.y * (thickness * 0.5f);
            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}